

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

double double_conversion::StrtodTrimmed(Vector<const_char> trimmed,int exponent)

{
  long lVar1;
  double dVar2;
  DiyFp diy_fp;
  Vector<const_char> buffer;
  Vector<const_char> trimmed_00;
  bool bVar3;
  int iVar4;
  uint64_t uVar5;
  undefined4 in_EDX;
  long in_FS_OFFSET;
  int comparison;
  bool is_correct;
  double guess;
  DiyFp upper_boundary;
  double in_stack_ffffffffffffff48;
  Double *this;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar6;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar7;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  trimmed_00._4_12_ = in_stack_ffffffffffffff94;
  trimmed_00.start_._0_4_ = in_stack_ffffffffffffff90;
  bVar3 = ComputeGuess(trimmed_00,in_stack_ffffffffffffff68,
                       (double *)CONCAT44(in_EDX,in_stack_ffffffffffffff60));
  uVar6 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff60);
  if (bVar3) {
    uVar6 = 0xffffffff;
    uVar7 = 0xffffffff;
  }
  else {
    this = (Double *)&stack0xffffffffffffff98;
    Double::Double(this,in_stack_ffffffffffffff48);
    Double::UpperBoundary((Double *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    buffer.start_._4_4_ = in_stack_ffffffffffffff6c;
    buffer.start_._0_4_ = in_stack_ffffffffffffff68;
    buffer._8_8_ = in_stack_ffffffffffffff70;
    diy_fp.f_._4_4_ = in_stack_ffffffffffffff5c;
    diy_fp.f_._0_4_ = in_stack_ffffffffffffff58;
    diy_fp.e_ = uVar6;
    diy_fp._12_4_ = in_EDX;
    iVar4 = CompareBufferWithDiyFp(buffer,0,diy_fp);
    if (iVar4 < 0) {
      uVar6 = 0xffffffff;
      uVar7 = 0xffffffff;
    }
    else if (iVar4 < 1) {
      Double::Double(this,in_stack_ffffffffffffff48);
      uVar5 = Double::Significand((Double *)CONCAT44(iVar4,in_stack_ffffffffffffff58));
      if ((uVar5 & 1) == 0) {
        uVar6 = 0xffffffff;
        uVar7 = 0xffffffff;
      }
      else {
        Double::Double(this,in_stack_ffffffffffffff48);
        dVar2 = Double::NextDouble((Double *)CONCAT44(iVar4,in_stack_ffffffffffffff58));
        uVar6 = SUB84(dVar2,0);
        uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
      }
    }
    else {
      Double::Double(this,in_stack_ffffffffffffff48);
      dVar2 = Double::NextDouble((Double *)CONCAT44(iVar4,in_stack_ffffffffffffff58));
      uVar6 = SUB84(dVar2,0);
      uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (double)CONCAT44(uVar7,uVar6);
  }
  __stack_chk_fail();
}

Assistant:

double StrtodTrimmed(Vector<const char> trimmed, int exponent) {
  DOUBLE_CONVERSION_ASSERT(trimmed.length() <= kMaxSignificantDecimalDigits);
  DOUBLE_CONVERSION_ASSERT(AssertTrimmedDigits(trimmed));
  double guess;
  const bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) {
    return guess;
  }
  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}